

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int memCmp_fast(void *buf1,void *buf2,size_t count)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  octet *b2;
  octet *b1;
  
  if (count != 0) {
    sVar3 = 0;
    do {
      bVar1 = *(byte *)((long)buf2 + sVar3);
      bVar2 = *(byte *)((long)buf1 + sVar3);
      if (bVar2 >= bVar1 && bVar2 != bVar1) {
        return 1;
      }
      if (bVar2 < bVar1) {
        return -1;
      }
      sVar3 = sVar3 + 1;
    } while (count != sVar3);
  }
  return 0;
}

Assistant:

int FAST(memCmp)(const void* buf1, const void* buf2, size_t count)
{
	const octet* b1 = (const octet*)buf1;
	const octet* b2 = (const octet*)buf2;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count--; ++b1, ++b2)
		if (*b1 > *b2)
			return 1;
		else if (*b1 < *b2)
			return -1;
	return 0;
}